

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniform01_dist.hpp
# Opt level: O0

result_type_conflict1 __thiscall
trng::uniform01_dist<float>::icdf(uniform01_dist<float> *this,result_type_conflict1 x)

{
  int *piVar1;
  float in_XMM0_Da;
  undefined4 local_4;
  
  if ((in_XMM0_Da < 0.0) || (local_4 = in_XMM0_Da, 1.0 < in_XMM0_Da)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    local_4 = std::numeric_limits<float>::quiet_NaN();
  }
  return local_4;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      return x;
    }